

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O0

void Sfm_DecPrepareVec(Vec_Int_t *vMap,int *pNodes,int nNodes,Vec_Int_t *vCut)

{
  int Entry;
  int local_2c;
  int i;
  Vec_Int_t *vCut_local;
  int nNodes_local;
  int *pNodes_local;
  Vec_Int_t *vMap_local;
  
  Vec_IntClear(vCut);
  for (local_2c = 0; local_2c < nNodes; local_2c = local_2c + 1) {
    Entry = Vec_IntEntry(vMap,pNodes[local_2c]);
    Vec_IntPush(vCut,Entry);
  }
  return;
}

Assistant:

void Sfm_DecPrepareVec( Vec_Int_t * vMap, int * pNodes, int nNodes, Vec_Int_t * vCut )
{
    int i;
    Vec_IntClear( vCut );
    for ( i = 0; i < nNodes; i++ )
        Vec_IntPush( vCut, Vec_IntEntry(vMap, pNodes[i]) );    
}